

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_remove_story_dependencies.hpp
# Opt level: O0

void PatchRemoveStoryDependencies::make_gumi_boulder_push_not_story_dependant(World *world)

{
  uint8_t entity_type;
  Map *pMVar1;
  Entity *this;
  EntityType *this_00;
  Position *pPVar2;
  Entity *pEVar3;
  vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> *pvVar4;
  __normal_iterator<EntityMaskFlag_*,_std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>_>
  local_88;
  const_iterator local_80;
  vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> *local_78;
  vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> *second_bear_masks;
  __normal_iterator<EntityMaskFlag_*,_std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>_>
  local_68;
  const_iterator local_60;
  vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> *local_58;
  vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> *first_bear_masks;
  allocator<char> local_39;
  string local_38;
  Entity *local_18;
  Entity *last_boulder;
  World *world_local;
  
  last_boulder = (Entity *)world;
  pMVar1 = World::map(world,0x1c1);
  this = Map::entity(pMVar1,'\x06');
  pEVar3 = last_boulder;
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"large_thin_yellow_platform",&local_39);
  this_00 = World::entity_type((World *)pEVar3,&local_38);
  entity_type = EntityType::id(this_00);
  Entity::entity_type_id(this,entity_type);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  Entity::entity_to_use_tiles_from(local_18,(Entity *)0x0);
  pPVar2 = Entity::position(local_18);
  pPVar2->half_z = true;
  Entity::palette(local_18,'\0');
  pMVar1 = World::map((World *)last_boulder,0x1c1);
  Map::remove_entity(pMVar1,'\x04',true);
  pMVar1 = World::map((World *)last_boulder,0x1c1);
  pEVar3 = Map::entity(pMVar1,'\x02');
  pvVar4 = Entity::mask_flags(pEVar3);
  local_58 = pvVar4;
  local_68._M_current =
       (EntityMaskFlag *)std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::begin(pvVar4)
  ;
  __gnu_cxx::
  __normal_iterator<EntityMaskFlag_const*,std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>>
  ::__normal_iterator<EntityMaskFlag*>
            ((__normal_iterator<EntityMaskFlag_const*,std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>>
              *)&local_60,&local_68);
  second_bear_masks =
       (vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> *)
       std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::erase(pvVar4,local_60);
  pMVar1 = World::map((World *)last_boulder,0x1c1);
  pEVar3 = Map::entity(pMVar1,'\x03');
  pvVar4 = Entity::mask_flags(pEVar3);
  local_78 = pvVar4;
  local_88._M_current =
       (EntityMaskFlag *)std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::begin(pvVar4)
  ;
  __gnu_cxx::
  __normal_iterator<EntityMaskFlag_const*,std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>>
  ::__normal_iterator<EntityMaskFlag*>
            ((__normal_iterator<EntityMaskFlag_const*,std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>>
              *)&local_80,&local_88);
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::erase(pvVar4,local_80);
  return;
}

Assistant:

static void make_gumi_boulder_push_not_story_dependant(World& world)
    {
        // Turn the last boulder into a platform to prevent any softlock
        Entity* last_boulder = world.map(MAP_ROUTE_GUMI_RYUMA_BOULDER)->entity(6);
        last_boulder->entity_type_id(world.entity_type("large_thin_yellow_platform")->id());
        last_boulder->entity_to_use_tiles_from(nullptr);
        last_boulder->position().half_z = true;
        last_boulder->palette(0);

        // Always remove Pockets from Gumi boulder map
        world.map(MAP_ROUTE_GUMI_RYUMA_BOULDER)->remove_entity(4);

        // Erase the first entity mask for each bear which makes them only appear under a specific scenario requirement
        std::vector<EntityMaskFlag>& first_bear_masks = world.map(MAP_ROUTE_GUMI_RYUMA_BOULDER)->entity(2)->mask_flags();
        first_bear_masks.erase(first_bear_masks.begin());

        std::vector<EntityMaskFlag>& second_bear_masks = world.map(MAP_ROUTE_GUMI_RYUMA_BOULDER)->entity(3)->mask_flags();
        second_bear_masks.erase(second_bear_masks.begin());
    }